

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QEasingCurve *item)

{
  QDebug *o;
  QDebug *pQVar1;
  QString *this;
  long *in_RDX;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  void *in_stack_fffffffffffffe88;
  QDebugStateSaver *in_stack_fffffffffffffe90;
  int precision;
  QString *in_stack_fffffffffffffe98;
  QByteArrayView *in_stack_fffffffffffffea0;
  QString *in_stack_fffffffffffffea8;
  QDebugStateSaver *in_stack_fffffffffffffeb0;
  Type value;
  QDebug *in_stack_fffffffffffffeb8;
  QChar fillChar;
  char *in_stack_fffffffffffffee8;
  QChar local_f2 [17];
  QByteArrayView in_stack_ffffffffffffff30;
  QChar local_aa [36];
  QChar local_62 [33];
  QDebug local_20 [2];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(in_stack_fffffffffffffeb0,(QDebug *)in_stack_fffffffffffffea8);
  value = (Type)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  o = QDebug::operator<<(in_stack_fffffffffffffeb8,in_stack_fffffffffffffee8);
  QDebug::QDebug(local_20,o);
  operator<<(in_stack_fffffffffffffeb8,value);
  pQVar1 = QDebug::operator<<(in_stack_fffffffffffffeb8,in_stack_fffffffffffffee8);
  fillChar.ucs = (char16_t)((ulong)pQVar1 >> 0x30);
  QDebug::operator<<((QDebug *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  QDebug::~QDebug(o);
  QDebug::~QDebug(o);
  if (*(long *)(*in_RDX + 8) != 0) {
    QByteArrayView::QByteArrayView<10ul>
              (in_stack_fffffffffffffea0,(char (*) [10])in_stack_fffffffffffffe98);
    precision = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    QString::fromLatin1(in_stack_ffffffffffffff30);
    QChar::QChar<char16_t,_true>(local_62,L' ');
    QString::arg<double,_true>
              (in_stack_fffffffffffffea8,(double)in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char)((ulong)in_stack_fffffffffffffe98 >> 0x18),precision,fillChar);
    this = (QString *)
           QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    QByteArrayView::QByteArrayView<7ul>
              (in_stack_fffffffffffffea0,(char (*) [7])in_stack_fffffffffffffe98);
    QString::fromLatin1(in_stack_ffffffffffffff30);
    in_stack_fffffffffffffea0 = *(QByteArrayView **)(*(long *)(*in_RDX + 8) + 0x18);
    QChar::QChar<char16_t,_true>(local_aa,L' ');
    QString::arg<double,_true>
              (this,(double)in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char)((ulong)in_stack_fffffffffffffe98 >> 0x18),precision,fillChar);
    in_stack_fffffffffffffe98 =
         (QString *)
         QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    QByteArrayView::QByteArrayView<13ul>
              (in_stack_fffffffffffffea0,(char (*) [13])in_stack_fffffffffffffe98);
    QString::fromLatin1(in_stack_ffffffffffffff30);
    in_stack_fffffffffffffe90 = *(QDebugStateSaver **)(*(long *)(*in_RDX + 8) + 0x20);
    QChar::QChar<char16_t,_true>(local_f2,L' ');
    QString::arg<double,_true>
              (this,(double)in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char)((ulong)in_stack_fffffffffffffe98 >> 0x18),
               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),fillChar);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    QString::~QString((QString *)0x70faa9);
    QString::~QString((QString *)0x70fab6);
    QString::~QString((QString *)0x70fac3);
    QString::~QString((QString *)0x70fad0);
    QString::~QString((QString *)0x70fadd);
    QString::~QString((QString *)0x70faea);
  }
  QDebug::QDebug((QDebug *)in_stack_fffffffffffffea0,(QDebug *)in_stack_fffffffffffffe98);
  QDebugStateSaver::~QDebugStateSaver(in_stack_fffffffffffffe90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QEasingCurve &item)
{
    QDebugStateSaver saver(debug);
    debug << "type:" << item.d_ptr->type
          << "func:" << reinterpret_cast<const void *>(item.d_ptr->func);
    if (item.d_ptr->config) {
        debug << QString::fromLatin1("period:%1").arg(item.d_ptr->config->_p, 0, 'f', 20)
              << QString::fromLatin1("amp:%1").arg(item.d_ptr->config->_a, 0, 'f', 20)
              << QString::fromLatin1("overshoot:%1").arg(item.d_ptr->config->_o, 0, 'f', 20);
    }
    return debug;
}